

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpInputStream::Message> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readMessage(HttpInputStreamImpl *this)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  byte extraout_AL;
  undefined8 *puVar4;
  Coroutine<kj::HttpInputStream::Message> *this_00;
  Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *promise;
  ArrayPtr<char> *pAVar5;
  Own<kj::AsyncInputStream,_std::nullptr_t> *other;
  OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr__;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  HttpInputStreamImpl *this_01;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_02;
  Message *value;
  undefined8 in_RSI;
  void *pvVar6;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  HttpMethod local_534 [5];
  undefined1 local_520 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  Fault f_1;
  bool local_4ea;
  DebugExpression<bool> local_4e9 [8];
  DebugExpression<bool> _kjCondition_1;
  Fault local_4d8;
  Fault f;
  DebugExpression<bool> _kjCondition;
  HttpInputStreamImpl *this_local;
  
  puVar4 = (undefined8 *)operator_new(0x4f8);
  *puVar4 = readMessage;
  puVar4[1] = readMessage;
  __return_storage_ptr__ =
       (OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)(puVar4 + 0x89);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       (puVar4 + 0x4a);
  this_01 = (HttpInputStreamImpl *)(puVar4 + 0x9c);
  this_02 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar4 + 0x99);
  value = (Message *)(puVar4 + 0x94);
  this_00 = (Coroutine<kj::HttpInputStream::Message> *)(puVar4 + 2);
  puVar4[0x9d] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar4 + 0x91),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"readMessage",0x5af);
  pvVar6 = (void *)puVar4[0x93];
  kj::_::Coroutine<kj::HttpInputStream::Message>::Coroutine
            (this_00,*(SourceLocation *)(puVar4 + 0x91));
  kj::_::Coroutine<kj::HttpInputStream::Message>::get_return_object
            ((Coroutine<kj::HttpInputStream::Message> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar3 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar4 + 0x4f5));
  if (bVar3) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar4 + 0x4f5));
    readMessageHeaders(this_01);
    promise = kj::_::Coroutine<kj::HttpInputStream::Message>::
              await_transform<kj::Promise<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>>
                        (this_00,(Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
                                  *)this_01);
    co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr___00,promise);
    bVar3 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
    if (!bVar3) {
      *(undefined1 *)((long)puVar4 + 0x4f4) = 1;
      _GLOBAL__N_1::HttpInputStreamImpl::readMessage
                ((void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),pvVar6);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume(__return_storage_ptr__,__return_storage_ptr___00);
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr___00);
    Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::~Promise
              ((Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
    f.exception._6_1_ =
         OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>::is<kj::ArrayPtr<char>>
                   ((OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError> *)
                    __return_storage_ptr__);
    f.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
    bVar3 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f.exception + 7));
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
                (&local_4d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5b1,FAILED,"textOrError.is<kj::ArrayPtr<char>>()","_kjCondition,\"bad message\""
                 ,(DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [12])"bad message");
      kj::_::Debug::Fault::fatal(&local_4d8);
    }
    pAVar5 = OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>::get<kj::ArrayPtr<char>>
                       ((OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError> *)
                        __return_storage_ptr__);
    lVar1 = puVar4[0x9d];
    sVar2 = pAVar5->size_;
    ((ArrayPtr<char> *)(puVar4 + 0x97))->ptr = pAVar5->ptr;
    puVar4[0x98] = sVar2;
    HttpHeaders::clear((HttpHeaders *)(lVar1 + 0x48));
    local_4ea = HttpHeaders::tryParse
                          ((HttpHeaders *)(puVar4[0x9d] + 0x48),*(ArrayPtr<char> *)(puVar4 + 0x97));
    local_4e9[0] = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4ea);
    bVar3 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)local_4e9);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
                ((Fault *)&body.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5b4,FAILED,"headers.tryParse(text)","_kjCondition,\"bad message\"",local_4e9,
                 (char (*) [12])"bad message");
      kj::_::Debug::Fault::fatal((Fault *)&body.ptr);
    }
    local_534[0] = GET;
    OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod,int>
              ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_02,local_534);
    getEntityBody((HttpInputStreamImpl *)local_520,(RequestOrResponse)puVar4[0x9d],
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)this_02,
                  (HttpHeaders *)0x0);
    lVar1 = puVar4[0x9d];
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_02);
    value->headers = (HttpHeaders *)(lVar1 + 0x48);
    other = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_520);
    Own<kj::AsyncInputStream,_std::nullptr_t>::Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)(puVar4 + 0x95),other);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Message>,_kj::HttpInputStream::Message>::
    return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Message>,_kj::HttpInputStream::Message>
                  *)this_00,value);
    HttpInputStream::Message::~Message(value);
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_520);
    OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>::~OneOf(__return_storage_ptr__);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar3 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x4f6));
    if (bVar3) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x4f6));
      kj::_::Coroutine<kj::HttpInputStream::Message>::~Coroutine(this_00);
      if (puVar4 != (undefined8 *)0x0) {
        operator_delete(puVar4,0x4f8);
      }
    }
    else {
      *puVar4 = 0;
      *(undefined1 *)((long)puVar4 + 0x4f4) = 2;
      _GLOBAL__N_1::HttpInputStreamImpl::readMessage
                ((void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),pvVar6);
    }
  }
  else {
    *(undefined1 *)((long)puVar4 + 0x4f4) = 0;
    _GLOBAL__N_1::HttpInputStreamImpl::readMessage
              ((void *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),pvVar6);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> readMessage() override {
    auto textOrError = co_await readMessageHeaders();
    KJ_REQUIRE(textOrError.is<kj::ArrayPtr<char>>(), "bad message");
    auto text = textOrError.get<kj::ArrayPtr<char>>();
    headers.clear();
    KJ_REQUIRE(headers.tryParse(text), "bad message");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, HttpMethod::GET, 0, headers);

    co_return { headers, kj::mv(body) };
  }